

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

TCGTargetOpDef * tcg_target_op_def(TCGOpcode op)

{
  TCGTargetOpDef *pTStack_10;
  TCGOpcode op_local;
  
  switch(op) {
  case INDEX_op_setcond_i32:
  case INDEX_op_setcond_i64:
    pTStack_10 = &tcg_target_op_def::setc;
    break;
  case INDEX_op_movcond_i32:
  case INDEX_op_movcond_i64:
    pTStack_10 = &tcg_target_op_def::movc;
    break;
  case INDEX_op_ld8u_i32:
  case INDEX_op_ld8s_i32:
  case INDEX_op_ld16u_i32:
  case INDEX_op_ld16s_i32:
  case INDEX_op_ld_i32:
  case INDEX_op_ld8u_i64:
  case INDEX_op_ld8s_i64:
  case INDEX_op_ld16u_i64:
  case INDEX_op_ld16s_i64:
  case INDEX_op_ld32u_i64:
  case INDEX_op_ld32s_i64:
  case INDEX_op_ld_i64:
    pTStack_10 = &tcg_target_op_def::r_r;
    break;
  case INDEX_op_st8_i32:
  case INDEX_op_st8_i64:
    pTStack_10 = &tcg_target_op_def::qi_r;
    break;
  case INDEX_op_st16_i32:
  case INDEX_op_st_i32:
  case INDEX_op_st16_i64:
  case INDEX_op_st32_i64:
    pTStack_10 = &tcg_target_op_def::ri_r;
    break;
  case INDEX_op_add_i32:
  case INDEX_op_add_i64:
    pTStack_10 = &tcg_target_op_def::r_r_re;
    break;
  case INDEX_op_sub_i32:
  case INDEX_op_mul_i32:
  case INDEX_op_or_i32:
  case INDEX_op_xor_i32:
  case INDEX_op_sub_i64:
  case INDEX_op_mul_i64:
  case INDEX_op_or_i64:
  case INDEX_op_xor_i64:
    pTStack_10 = &tcg_target_op_def::r_0_re;
    break;
  default:
    pTStack_10 = (TCGTargetOpDef *)0x0;
    break;
  case INDEX_op_div2_i32:
  case INDEX_op_divu2_i32:
  case INDEX_op_div2_i64:
  case INDEX_op_divu2_i64:
    pTStack_10 = &tcg_target_op_def::div2;
    break;
  case INDEX_op_and_i32:
  case INDEX_op_and_i64:
    pTStack_10 = &tcg_target_op_def::and;
    break;
  case INDEX_op_shl_i32:
  case INDEX_op_shr_i32:
  case INDEX_op_sar_i32:
  case INDEX_op_shl_i64:
  case INDEX_op_shr_i64:
  case INDEX_op_sar_i64:
    pTStack_10 = &tcg_target_op_def::r_0_ci;
    if (have_bmi2) {
      pTStack_10 = &tcg_target_op_def::r_r_ri;
    }
    break;
  case INDEX_op_rotl_i32:
  case INDEX_op_rotr_i32:
  case INDEX_op_rotl_i64:
  case INDEX_op_rotr_i64:
    pTStack_10 = &tcg_target_op_def::r_0_ci;
    break;
  case INDEX_op_deposit_i32:
  case INDEX_op_deposit_i64:
    pTStack_10 = &tcg_target_op_def::dep;
    break;
  case INDEX_op_extract_i32:
  case INDEX_op_sextract_i32:
  case INDEX_op_ext16s_i32:
  case INDEX_op_ext16u_i32:
  case INDEX_op_ctpop_i32:
  case INDEX_op_extract_i64:
  case INDEX_op_ext_i32_i64:
  case INDEX_op_extu_i32_i64:
  case INDEX_op_extrl_i64_i32:
  case INDEX_op_ext16s_i64:
  case INDEX_op_ext32s_i64:
  case INDEX_op_ext16u_i64:
  case INDEX_op_ext32u_i64:
  case INDEX_op_ctpop_i64:
    pTStack_10 = &tcg_target_op_def::r_r;
    break;
  case INDEX_op_extract2_i32:
  case INDEX_op_extract2_i64:
    pTStack_10 = &tcg_target_op_def::r_0_r;
    break;
  case INDEX_op_brcond_i32:
  case INDEX_op_brcond_i64:
    pTStack_10 = &tcg_target_op_def::r_re;
    break;
  case INDEX_op_add2_i32:
  case INDEX_op_sub2_i32:
  case INDEX_op_add2_i64:
  case INDEX_op_sub2_i64:
    pTStack_10 = &tcg_target_op_def::arith2;
    break;
  case INDEX_op_mulu2_i32:
  case INDEX_op_muls2_i32:
  case INDEX_op_mulu2_i64:
  case INDEX_op_muls2_i64:
    pTStack_10 = &tcg_target_op_def::mul2;
    break;
  case INDEX_op_brcond2_i32:
    pTStack_10 = &tcg_target_op_def::b2;
    break;
  case INDEX_op_setcond2_i32:
    pTStack_10 = &tcg_target_op_def::s2;
    break;
  case INDEX_op_ext8s_i32:
  case INDEX_op_ext8u_i32:
  case INDEX_op_ext8s_i64:
  case INDEX_op_ext8u_i64:
    pTStack_10 = &tcg_target_op_def::r_q;
    break;
  case INDEX_op_bswap16_i32:
  case INDEX_op_bswap32_i32:
  case INDEX_op_not_i32:
  case INDEX_op_neg_i32:
  case INDEX_op_extrh_i64_i32:
  case INDEX_op_bswap16_i64:
  case INDEX_op_bswap32_i64:
  case INDEX_op_bswap64_i64:
  case INDEX_op_not_i64:
  case INDEX_op_neg_i64:
    pTStack_10 = &tcg_target_op_def::r_0;
    break;
  case INDEX_op_andc_i32:
  case INDEX_op_andc_i64:
    pTStack_10 = &tcg_target_op_def::andc;
    break;
  case INDEX_op_clz_i32:
  case INDEX_op_clz_i64:
    pTStack_10 = tcg_target_op_def::clz + have_lzcnt;
    break;
  case INDEX_op_ctz_i32:
  case INDEX_op_ctz_i64:
    pTStack_10 = tcg_target_op_def::ctz + have_bmi1_tricore;
    break;
  case INDEX_op_st_i64:
    pTStack_10 = &tcg_target_op_def::re_r;
    break;
  case INDEX_op_goto_ptr:
    pTStack_10 = &tcg_target_op_def::r;
    break;
  case INDEX_op_qemu_ld_i32:
    pTStack_10 = &tcg_target_op_def::r_L;
    break;
  case INDEX_op_qemu_st_i32:
    pTStack_10 = &tcg_target_op_def::L_L;
    break;
  case INDEX_op_qemu_ld_i64:
    pTStack_10 = &tcg_target_op_def::r_L;
    break;
  case INDEX_op_qemu_st_i64:
    pTStack_10 = &tcg_target_op_def::L_L;
    break;
  case INDEX_op_dup_vec:
  case INDEX_op_abs_vec:
  case INDEX_op_shli_vec:
  case INDEX_op_shri_vec:
  case INDEX_op_sari_vec:
  case INDEX_op_x86_psrldq_vec:
    pTStack_10 = &tcg_target_op_def::x_x;
    break;
  case INDEX_op_ld_vec:
  case INDEX_op_st_vec:
  case INDEX_op_dupm_vec:
    pTStack_10 = &tcg_target_op_def::x_r;
    break;
  case INDEX_op_add_vec:
  case INDEX_op_sub_vec:
  case INDEX_op_mul_vec:
  case INDEX_op_ssadd_vec:
  case INDEX_op_usadd_vec:
  case INDEX_op_sssub_vec:
  case INDEX_op_ussub_vec:
  case INDEX_op_smin_vec:
  case INDEX_op_umin_vec:
  case INDEX_op_smax_vec:
  case INDEX_op_umax_vec:
  case INDEX_op_and_vec:
  case INDEX_op_or_vec:
  case INDEX_op_xor_vec:
  case INDEX_op_andc_vec:
  case INDEX_op_shls_vec:
  case INDEX_op_shrs_vec:
  case INDEX_op_sars_vec:
  case INDEX_op_shlv_vec:
  case INDEX_op_shrv_vec:
  case INDEX_op_sarv_vec:
  case INDEX_op_cmp_vec:
  case INDEX_op_x86_shufps_vec:
  case INDEX_op_x86_blend_vec:
  case INDEX_op_x86_packss_vec:
  case INDEX_op_x86_packus_vec:
  case INDEX_op_x86_vperm2i128_vec:
  case INDEX_op_x86_punpckl_vec:
  case INDEX_op_x86_punpckh_vec:
    pTStack_10 = &tcg_target_op_def::x_x_x;
    break;
  case INDEX_op_x86_vpblendvb_vec:
    pTStack_10 = &tcg_target_op_def::x_x_x_x;
  }
  return pTStack_10;
}

Assistant:

static const TCGTargetOpDef *tcg_target_op_def(TCGOpcode op)
{
    static const TCGTargetOpDef r = { .args_ct_str = { "r" } };
    static const TCGTargetOpDef ri_r = { .args_ct_str = { "ri", "r" } };
    static const TCGTargetOpDef re_r = { .args_ct_str = { "re", "r" } };
    static const TCGTargetOpDef qi_r = { .args_ct_str = { "qi", "r" } };
    static const TCGTargetOpDef r_r = { .args_ct_str = { "r", "r" } };
    static const TCGTargetOpDef r_q = { .args_ct_str = { "r", "q" } };
    static const TCGTargetOpDef r_re = { .args_ct_str = { "r", "re" } };
    static const TCGTargetOpDef r_0 = { .args_ct_str = { "r", "0" } };
    static const TCGTargetOpDef r_r_ri = { .args_ct_str = { "r", "r", "ri" } };
    static const TCGTargetOpDef r_r_re = { .args_ct_str = { "r", "r", "re" } };
    static const TCGTargetOpDef r_0_r = { .args_ct_str = { "r", "0", "r" } };
    static const TCGTargetOpDef r_0_re = { .args_ct_str = { "r", "0", "re" } };
    static const TCGTargetOpDef r_0_ci = { .args_ct_str = { "r", "0", "ci" } };
    static const TCGTargetOpDef r_L = { .args_ct_str = { "r", "L" } };
    static const TCGTargetOpDef L_L = { .args_ct_str = { "L", "L" } };
    static const TCGTargetOpDef r_L_L = { .args_ct_str = { "r", "L", "L" } };
    static const TCGTargetOpDef r_r_L = { .args_ct_str = { "r", "r", "L" } };
    static const TCGTargetOpDef L_L_L = { .args_ct_str = { "L", "L", "L" } };
    static const TCGTargetOpDef r_r_L_L
        = { .args_ct_str = { "r", "r", "L", "L" } };
    static const TCGTargetOpDef L_L_L_L
        = { .args_ct_str = { "L", "L", "L", "L" } };
    static const TCGTargetOpDef x_x = { .args_ct_str = { "x", "x" } };
    static const TCGTargetOpDef x_x_x = { .args_ct_str = { "x", "x", "x" } };
    static const TCGTargetOpDef x_x_x_x
        = { .args_ct_str = { "x", "x", "x", "x" } };
    static const TCGTargetOpDef x_r = { .args_ct_str = { "x", "r" } };

    switch (op) {
    case INDEX_op_goto_ptr:
        return &r;

    case INDEX_op_ld8u_i32:
    case INDEX_op_ld8u_i64:
    case INDEX_op_ld8s_i32:
    case INDEX_op_ld8s_i64:
    case INDEX_op_ld16u_i32:
    case INDEX_op_ld16u_i64:
    case INDEX_op_ld16s_i32:
    case INDEX_op_ld16s_i64:
    case INDEX_op_ld_i32:
    case INDEX_op_ld32u_i64:
    case INDEX_op_ld32s_i64:
    case INDEX_op_ld_i64:
        return &r_r;

    case INDEX_op_st8_i32:
    case INDEX_op_st8_i64:
        return &qi_r;
    case INDEX_op_st16_i32:
    case INDEX_op_st16_i64:
    case INDEX_op_st_i32:
    case INDEX_op_st32_i64:
        return &ri_r;
    case INDEX_op_st_i64:
        return &re_r;

    case INDEX_op_add_i32:
    case INDEX_op_add_i64:
        return &r_r_re;
    case INDEX_op_sub_i32:
    case INDEX_op_sub_i64:
    case INDEX_op_mul_i32:
    case INDEX_op_mul_i64:
    case INDEX_op_or_i32:
    case INDEX_op_or_i64:
    case INDEX_op_xor_i32:
    case INDEX_op_xor_i64:
        return &r_0_re;

    case INDEX_op_and_i32:
    case INDEX_op_and_i64:
        {
            static const TCGTargetOpDef and
                = { .args_ct_str = { "r", "0", "reZ" } };
            return &and;
        }
        break;
    case INDEX_op_andc_i32:
    case INDEX_op_andc_i64:
        {
            static const TCGTargetOpDef andc
                = { .args_ct_str = { "r", "r", "rI" } };
            return &andc;
        }
        break;

    case INDEX_op_shl_i32:
    case INDEX_op_shl_i64:
    case INDEX_op_shr_i32:
    case INDEX_op_shr_i64:
    case INDEX_op_sar_i32:
    case INDEX_op_sar_i64:
        return have_bmi2 ? &r_r_ri : &r_0_ci;
    case INDEX_op_rotl_i32:
    case INDEX_op_rotl_i64:
    case INDEX_op_rotr_i32:
    case INDEX_op_rotr_i64:
        return &r_0_ci;

    case INDEX_op_brcond_i32:
    case INDEX_op_brcond_i64:
        return &r_re;

    case INDEX_op_bswap16_i32:
    case INDEX_op_bswap16_i64:
    case INDEX_op_bswap32_i32:
    case INDEX_op_bswap32_i64:
    case INDEX_op_bswap64_i64:
    case INDEX_op_neg_i32:
    case INDEX_op_neg_i64:
    case INDEX_op_not_i32:
    case INDEX_op_not_i64:
    case INDEX_op_extrh_i64_i32:
        return &r_0;

    case INDEX_op_ext8s_i32:
    case INDEX_op_ext8s_i64:
    case INDEX_op_ext8u_i32:
    case INDEX_op_ext8u_i64:
        return &r_q;
    case INDEX_op_ext16s_i32:
    case INDEX_op_ext16s_i64:
    case INDEX_op_ext16u_i32:
    case INDEX_op_ext16u_i64:
    case INDEX_op_ext32s_i64:
    case INDEX_op_ext32u_i64:
    case INDEX_op_ext_i32_i64:
    case INDEX_op_extu_i32_i64:
    case INDEX_op_extrl_i64_i32:
    case INDEX_op_extract_i32:
    case INDEX_op_extract_i64:
    case INDEX_op_sextract_i32:
    case INDEX_op_ctpop_i32:
    case INDEX_op_ctpop_i64:
        return &r_r;
    case INDEX_op_extract2_i32:
    case INDEX_op_extract2_i64:
        return &r_0_r;

    case INDEX_op_deposit_i32:
    case INDEX_op_deposit_i64:
        {
            static const TCGTargetOpDef dep
                = { .args_ct_str = { "Q", "0", "Q" } };
            return &dep;
        }
    case INDEX_op_setcond_i32:
    case INDEX_op_setcond_i64:
        {
            static const TCGTargetOpDef setc
                = { .args_ct_str = { "q", "r", "re" } };
            return &setc;
        }
    case INDEX_op_movcond_i32:
    case INDEX_op_movcond_i64:
        {
            static const TCGTargetOpDef movc
                = { .args_ct_str = { "r", "r", "re", "r", "0" } };
            return &movc;
        }
    case INDEX_op_div2_i32:
    case INDEX_op_div2_i64:
    case INDEX_op_divu2_i32:
    case INDEX_op_divu2_i64:
        {
            static const TCGTargetOpDef div2
                = { .args_ct_str = { "a", "d", "0", "1", "r" } };
            return &div2;
        }
    case INDEX_op_mulu2_i32:
    case INDEX_op_mulu2_i64:
    case INDEX_op_muls2_i32:
    case INDEX_op_muls2_i64:
        {
            static const TCGTargetOpDef mul2
                = { .args_ct_str = { "a", "d", "a", "r" } };
            return &mul2;
        }
    case INDEX_op_add2_i32:
    case INDEX_op_add2_i64:
    case INDEX_op_sub2_i32:
    case INDEX_op_sub2_i64:
        {
            static const TCGTargetOpDef arith2
                = { .args_ct_str = { "r", "r", "0", "1", "re", "re" } };
            return &arith2;
        }
    case INDEX_op_ctz_i32:
    case INDEX_op_ctz_i64:
        {
            static const TCGTargetOpDef ctz[2] = {
                { .args_ct_str = { "&r", "r", "r" } },
                { .args_ct_str = { "&r", "r", "rW" } },
            };
            return &ctz[have_bmi1];
        }
    case INDEX_op_clz_i32:
    case INDEX_op_clz_i64:
        {
            static const TCGTargetOpDef clz[2] = {
                { .args_ct_str = { "&r", "r", "r" } },
                { .args_ct_str = { "&r", "r", "rW" } },
            };
            return &clz[have_lzcnt];
        }

    case INDEX_op_qemu_ld_i32:
        return TARGET_LONG_BITS <= TCG_TARGET_REG_BITS ? &r_L : &r_L_L;
    case INDEX_op_qemu_st_i32:
        return TARGET_LONG_BITS <= TCG_TARGET_REG_BITS ? &L_L : &L_L_L;
    case INDEX_op_qemu_ld_i64:
        return (TCG_TARGET_REG_BITS == 64 ? &r_L
                : TARGET_LONG_BITS <= TCG_TARGET_REG_BITS ? &r_r_L
                : &r_r_L_L);
    case INDEX_op_qemu_st_i64:
        return (TCG_TARGET_REG_BITS == 64 ? &L_L
                : TARGET_LONG_BITS <= TCG_TARGET_REG_BITS ? &L_L_L
                : &L_L_L_L);

    case INDEX_op_brcond2_i32:
        {
            static const TCGTargetOpDef b2
                = { .args_ct_str = { "r", "r", "ri", "ri" } };
            return &b2;
        }
    case INDEX_op_setcond2_i32:
        {
            static const TCGTargetOpDef s2
                = { .args_ct_str = { "r", "r", "r", "ri", "ri" } };
            return &s2;
        }

    case INDEX_op_ld_vec:
    case INDEX_op_st_vec:
    case INDEX_op_dupm_vec:
        return &x_r;

    case INDEX_op_add_vec:
    case INDEX_op_sub_vec:
    case INDEX_op_mul_vec:
    case INDEX_op_and_vec:
    case INDEX_op_or_vec:
    case INDEX_op_xor_vec:
    case INDEX_op_andc_vec:
    case INDEX_op_ssadd_vec:
    case INDEX_op_usadd_vec:
    case INDEX_op_sssub_vec:
    case INDEX_op_ussub_vec:
    case INDEX_op_smin_vec:
    case INDEX_op_umin_vec:
    case INDEX_op_smax_vec:
    case INDEX_op_umax_vec:
    case INDEX_op_shlv_vec:
    case INDEX_op_shrv_vec:
    case INDEX_op_sarv_vec:
    case INDEX_op_shls_vec:
    case INDEX_op_shrs_vec:
    case INDEX_op_sars_vec:
    case INDEX_op_cmp_vec:
    case INDEX_op_x86_shufps_vec:
    case INDEX_op_x86_blend_vec:
    case INDEX_op_x86_packss_vec:
    case INDEX_op_x86_packus_vec:
    case INDEX_op_x86_vperm2i128_vec:
    case INDEX_op_x86_punpckl_vec:
    case INDEX_op_x86_punpckh_vec:
#if TCG_TARGET_REG_BITS == 32
    case INDEX_op_dup2_vec:
#endif
        return &x_x_x;
    case INDEX_op_abs_vec:
    case INDEX_op_dup_vec:
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
    case INDEX_op_sari_vec:
    case INDEX_op_x86_psrldq_vec:
        return &x_x;
    case INDEX_op_x86_vpblendvb_vec:
        return &x_x_x_x;

    default:
        break;
    }
    return NULL;
}